

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr-event.c
# Opt level: O0

natwm_error handle_randr_event(natwm_state *state,xcb_generic_event_t *event,uint8_t event_type)

{
  xcb_query_extension_reply_t *pxVar1;
  xcb_query_extension_reply_t *cache;
  uint8_t event_type_local;
  xcb_generic_event_t *event_local;
  natwm_state *state_local;
  
  pxVar1 = state->monitor_list->extension->data_cache;
  if ((uint)event_type == pxVar1->first_event + 1) {
    state_local._4_4_ = handle_randr_notify_event(state,(xcb_randr_notify_event_t *)event);
  }
  else if (event_type == pxVar1->first_event) {
    state_local._4_4_ =
         handle_randr_screen_change_event(state,(xcb_randr_screen_change_notify_event_t *)event);
  }
  else {
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error handle_randr_event(const struct natwm_state *state,
                                    const xcb_generic_event_t *event, uint8_t event_type)
{
        const xcb_query_extension_reply_t *cache = state->monitor_list->extension->data_cache;

        if (event_type == (cache->first_event + XCB_RANDR_NOTIFY)) {
                return handle_randr_notify_event(state, (const xcb_randr_notify_event_t *)event);
        }

        if (event_type == (cache->first_event + XCB_RANDR_SCREEN_CHANGE_NOTIFY)) {
                return handle_randr_screen_change_event(
                        state, (const xcb_randr_screen_change_notify_event_t *)event);
        }

        return NO_ERROR;
}